

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O0

SubcaseBasePtr deqp::TestSubcase::Create<glcts::(anonymous_namespace)::OffsetGatherFloat2DR>(void)

{
  OffsetGatherFloat2DR *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (OffsetGatherFloat2DR *)operator_new(0x50);
  (this->super_OffsetGatherFloat2D).super_GatherBase.rbo = 0;
  (this->super_OffsetGatherFloat2D).super_GatherBase.program = 0;
  (this->super_OffsetGatherFloat2D).super_GatherBase.vao = 0;
  (this->super_OffsetGatherFloat2D).super_GatherBase.vbo = 0;
  (this->super_OffsetGatherFloat2D).super_GatherBase.super_TGBase.pixelFormat = (PixelFormat *)0x0;
  (this->super_OffsetGatherFloat2D).super_GatherBase.tex = 0;
  (this->super_OffsetGatherFloat2D).super_GatherBase.fbo = 0;
  (this->super_OffsetGatherFloat2D).super_GatherBase.super_TGBase.super_SubcaseBase.super_GLWrapper.
  m_context = (Context *)0x0;
  (this->super_OffsetGatherFloat2D).super_GatherBase.super_TGBase.renderTarget = (RenderTarget *)0x0
  ;
  (this->super_OffsetGatherFloat2D).super_GatherBase.super_TGBase.super_SubcaseBase.super_GLWrapper.
  super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_OffsetGatherFloat2D).super_GatherBase.super_TGBase.super_SubcaseBase.
    super_GLWrapper.super_CallLogWrapper.m_enableLog = 0;
  (this->super_OffsetGatherFloat2D).super_GatherBase.super_TGBase.super_SubcaseBase.super_GLWrapper.
  _vptr_GLWrapper = (_func_int **)0x0;
  (this->super_OffsetGatherFloat2D).super_GatherBase.super_TGBase.super_SubcaseBase.super_GLWrapper.
  super_CallLogWrapper.m_gl = (Functions *)0x0;
  glcts::anon_unknown_0::OffsetGatherFloat2DR::OffsetGatherFloat2DR(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}